

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O3

void __thiscall btMultiBodyDynamicsWorld::clearMultiBodyForces(btMultiBodyDynamicsWorld *this)

{
  btMultiBody *this_00;
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  CProfileManager::Start_Profile("clearMultiBodyForces");
  iVar2 = (this->m_multiBodies).m_size;
  if (0 < iVar2) {
    lVar5 = 0;
    do {
      this_00 = (this->m_multiBodies).m_data[lVar5];
      if (this_00->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = *(int *)(this_00->m_baseCollider + 0xec) == 2;
      }
      lVar3 = (long)(this_00->m_links).m_size;
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          lVar1 = *(long *)((long)((this_00->m_links).m_data)->m_jointTorque + lVar4 + 0x1c);
          if (lVar1 != 0) {
            bVar6 = (bool)(bVar6 | *(int *)(lVar1 + 0xec) == 2);
          }
          lVar4 = lVar4 + 600;
        } while (lVar3 * 600 - lVar4 != 0);
      }
      if (!bVar6) {
        btMultiBody::clearForcesAndTorques(this_00);
        iVar2 = (this->m_multiBodies).m_size;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar2);
  }
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void btMultiBodyDynamicsWorld::clearMultiBodyForces()
{
              {
                BT_PROFILE("clearMultiBodyForces");
                for (int i=0;i<this->m_multiBodies.size();i++)
                {
                        btMultiBody* bod = m_multiBodies[i];

                        bool isSleeping = false;

                        if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
                        {       
                                isSleeping = true;
                        }
                        for (int b=0;b<bod->getNumLinks();b++)
                        {       
                                if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)     
                                        isSleeping = true;
                        }

                        if (!isSleeping)
                        {
                        btMultiBody* bod = m_multiBodies[i];
                        bod->clearForcesAndTorques();
                	}
		}
	}

}